

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  seqDef **ppsVar3;
  ulong *puVar4;
  ulong *puVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  U32 *pUVar10;
  U32 *pUVar11;
  long lVar12;
  seqDef *psVar13;
  uint uVar14;
  uint uVar15;
  BYTE *op;
  long *plVar16;
  ulong *puVar17;
  long *plVar18;
  BYTE *pBVar19;
  byte bVar20;
  byte bVar21;
  ulong uVar22;
  BYTE *pBVar23;
  BYTE *pBVar24;
  long *plVar25;
  long *plVar26;
  ulong *puVar27;
  U32 UVar28;
  ulong uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  BYTE *op_4;
  uint uVar33;
  BYTE *pBVar34;
  ulong uVar35;
  ulong uVar36;
  BYTE *ip;
  long *plVar37;
  uint uVar38;
  uint uVar39;
  int iVar40;
  ulong *puVar41;
  long unaff_R15;
  U32 *hashSmall;
  uint local_dc;
  long local_d8;
  ulong *local_d0;
  int local_b8;
  BYTE *base;
  BYTE *iend;
  U32 prefixLowestIndex;
  int local_50;
  U32 *hashLong;
  BYTE *ilimit;
  BYTE *prefixLowest;
  
  pBVar9 = (ms->window).base;
  uVar15 = (ms->window).dictLimit;
  pBVar34 = pBVar9 + uVar15;
  puVar5 = (ulong *)((long)src + srcSize);
  plVar16 = (long *)((long)src + (srcSize - 8));
  uVar7 = *rep;
  uVar8 = rep[1];
  plVar26 = (long *)((ulong)((int)src == (int)pBVar34) + (long)src);
  uVar30 = (int)plVar26 - (int)pBVar34;
  local_dc = uVar8;
  if (uVar30 < uVar8) {
    local_dc = 0;
  }
  uVar38 = 0;
  if (uVar7 <= uVar30) {
    uVar38 = uVar7;
  }
  uVar14 = (ms->cParams).minMatch;
  pUVar10 = ms->hashTable;
  pUVar11 = ms->chainTable;
  iVar40 = (int)pBVar9;
  if (uVar14 == 5) {
    if (plVar26 < plVar16) {
      bVar20 = 0x40 - (char)(ms->cParams).hashLog;
      bVar21 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar17 = (ulong *)((long)puVar5 - 1);
      ppsVar3 = &seqStore->sequences;
      uVar14 = 0xbb000000;
      do {
        lVar12 = *plVar26;
        uVar29 = (ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
        uVar35 = (ulong)(lVar12 * -0x30e4432345000000) >> (bVar21 & 0x3f);
        uVar39 = pUVar10[uVar29];
        uVar33 = pUVar11[uVar35];
        UVar28 = (U32)((long)plVar26 - (long)pBVar9);
        pUVar11[uVar35] = UVar28;
        pUVar10[uVar29] = UVar28;
        plVar18 = (long *)((long)plVar26 + 1);
        if ((uVar38 == 0) ||
           (uVar29 = (ulong)uVar38, *(int *)((long)plVar18 - uVar29) != *(int *)((long)plVar26 + 1))
           ) {
          if ((uVar15 < uVar39) && (plVar37 = (long *)(pBVar9 + uVar39), *plVar37 == lVar12)) {
            puVar4 = (ulong *)(plVar26 + 1);
            puVar41 = (ulong *)(plVar37 + 1);
            puVar27 = puVar4;
            if (puVar4 < puVar1) {
              uVar35 = *puVar4 ^ *puVar41;
              uVar29 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar29 = uVar29 >> 3 & 0x1fffffff;
              if (*puVar41 == *puVar4) {
                puVar27 = (ulong *)(plVar26 + 2);
                puVar41 = (ulong *)(plVar37 + 2);
                do {
                  if (puVar1 <= puVar27) goto LAB_004dc002;
                  uVar35 = *puVar41;
                  uVar22 = *puVar27;
                  uVar36 = uVar22 ^ uVar35;
                  uVar29 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                    }
                  }
                  uVar29 = (long)puVar27 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar4);
                  puVar27 = puVar27 + 1;
                  puVar41 = puVar41 + 1;
                } while (uVar35 == uVar22);
              }
            }
            else {
LAB_004dc002:
              if ((puVar27 < puVar2) && ((int)*puVar41 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                puVar41 = (ulong *)((long)puVar41 + 4);
              }
              if ((puVar27 < puVar17) && ((short)*puVar41 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                puVar41 = (ulong *)((long)puVar41 + 2);
              }
              if (puVar27 < puVar5) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar41 == (char)*puVar27));
              }
              uVar29 = (long)puVar27 - (long)puVar4;
            }
            unaff_R15 = uVar29 + 8;
            uVar14 = (int)plVar26 - (int)plVar37;
            plVar18 = plVar26;
            if ((uVar15 < uVar39) && (src < plVar26)) {
              pBVar23 = pBVar9 + ((ulong)uVar39 - 1);
              do {
                plVar37 = (long *)((long)plVar18 - 1);
                if (((BYTE)*plVar37 != *pBVar23) ||
                   (unaff_R15 = unaff_R15 + 1, plVar18 = plVar37, pBVar23 <= pBVar34)) break;
                pBVar23 = pBVar23 + -1;
              } while (src < plVar37);
            }
LAB_004dc284:
            uVar29 = (long)plVar18 - (long)src;
            plVar25 = (long *)seqStore->lit;
            plVar37 = (long *)((long)plVar25 + uVar29);
            do {
              *plVar25 = *src;
              plVar25 = plVar25 + 1;
              src = (void *)((long)src + 8);
            } while (plVar25 < plVar37);
            seqStore->lit = seqStore->lit + uVar29;
            if (0xffff < uVar29) {
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            uVar35 = unaff_R15 - 3;
            psVar13 = *ppsVar3;
            psVar13->litLength = (U16)uVar29;
            psVar13->offset = uVar14 + 3;
            local_dc = uVar38;
            uVar38 = uVar14;
            goto joined_r0x004dc2f6;
          }
          if ((uVar15 < uVar33) && (piVar6 = (int *)(pBVar9 + uVar33), *piVar6 == (int)*plVar26)) {
            lVar12 = *plVar18;
            uVar29 = (ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
            uVar39 = pUVar10[uVar29];
            pUVar10[uVar29] = UVar28 + 1;
            plVar37 = plVar26;
            iVar32 = 0;
            if ((uVar15 < uVar39) && (plVar25 = (long *)(pBVar9 + uVar39), *plVar25 == lVar12)) {
              puVar4 = (ulong *)((long)plVar26 + 9);
              puVar27 = (ulong *)(plVar25 + 1);
              puVar41 = puVar4;
              if (puVar4 < puVar1) {
                uVar35 = *puVar4 ^ *puVar27;
                uVar29 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                uVar29 = uVar29 >> 3 & 0x1fffffff;
                if (*puVar27 == *puVar4) {
                  puVar41 = (ulong *)((long)plVar26 + 0x11);
                  puVar27 = (ulong *)(plVar25 + 2);
                  do {
                    if (puVar1 <= puVar41) goto LAB_004dc0b8;
                    uVar35 = *puVar27;
                    uVar22 = *puVar41;
                    uVar36 = uVar22 ^ uVar35;
                    uVar29 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                      }
                    }
                    uVar29 = (long)puVar41 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar4);
                    puVar41 = puVar41 + 1;
                    puVar27 = puVar27 + 1;
                  } while (uVar35 == uVar22);
                }
              }
              else {
LAB_004dc0b8:
                if ((puVar41 < puVar2) && ((int)*puVar27 == (int)*puVar41)) {
                  puVar41 = (ulong *)((long)puVar41 + 4);
                  puVar27 = (ulong *)((long)puVar27 + 4);
                }
                if ((puVar41 < puVar17) && ((short)*puVar27 == (short)*puVar41)) {
                  puVar41 = (ulong *)((long)puVar41 + 2);
                  puVar27 = (ulong *)((long)puVar27 + 2);
                }
                if (puVar41 < puVar5) {
                  puVar41 = (ulong *)((long)puVar41 + (ulong)((char)*puVar27 == (char)*puVar41));
                }
                uVar29 = (long)puVar41 - (long)puVar4;
              }
              unaff_R15 = uVar29 + 8;
              iend._0_4_ = (int)plVar25;
              uVar14 = (int)plVar18 - (int)iend;
              iVar31 = 7;
              plVar37 = plVar18;
              iVar32 = 7;
              if ((uVar15 < uVar39) && (iVar32 = iVar31, src < plVar18)) {
                pBVar23 = pBVar9 + ((ulong)uVar39 - 1);
                plVar18 = plVar26;
                while (plVar37 = plVar18, (BYTE)*plVar37 == *pBVar23) {
                  unaff_R15 = unaff_R15 + 1;
                  if ((pBVar23 <= pBVar34) ||
                     (pBVar23 = pBVar23 + -1, plVar18 = (long *)((long)plVar37 + -1), plVar37 <= src
                     )) goto LAB_004dc164;
                }
                plVar37 = (long *)((long)plVar37 + 1);
              }
            }
LAB_004dc164:
            plVar18 = plVar37;
            if (iVar32 != 7) {
              if (iVar32 != 0) goto LAB_004dbfef;
              puVar4 = (ulong *)((long)plVar37 + 4);
              puVar41 = (ulong *)(piVar6 + 1);
              puVar27 = puVar4;
              if (puVar4 < puVar1) {
                uVar35 = *puVar4 ^ *puVar41;
                uVar29 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                uVar29 = uVar29 >> 3 & 0x1fffffff;
                if (*puVar41 == *puVar4) {
                  puVar27 = (ulong *)((long)plVar37 + 0xc);
                  puVar41 = (ulong *)(piVar6 + 3);
                  do {
                    if (puVar1 <= puVar27) goto LAB_004dc1e4;
                    uVar35 = *puVar41;
                    uVar22 = *puVar27;
                    uVar36 = uVar22 ^ uVar35;
                    uVar29 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                      }
                    }
                    uVar29 = (long)puVar27 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar4);
                    puVar27 = puVar27 + 1;
                    puVar41 = puVar41 + 1;
                  } while (uVar35 == uVar22);
                }
              }
              else {
LAB_004dc1e4:
                if ((puVar27 < puVar2) && ((int)*puVar41 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar41 = (ulong *)((long)puVar41 + 4);
                }
                if ((puVar27 < puVar17) && ((short)*puVar41 == (short)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar41 = (ulong *)((long)puVar41 + 2);
                }
                if (puVar27 < puVar5) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar41 == (char)*puVar27));
                }
                uVar29 = (long)puVar27 - (long)puVar4;
              }
              unaff_R15 = uVar29 + 4;
              uVar14 = (int)plVar37 - (int)piVar6;
              if ((uVar15 < uVar33) && (src < plVar37)) {
                pBVar23 = pBVar9 + ((ulong)uVar33 - 1);
                do {
                  plVar25 = (long *)((long)plVar37 - 1);
                  plVar18 = plVar37;
                  if (((BYTE)*plVar25 != *pBVar23) ||
                     (unaff_R15 = unaff_R15 + 1, plVar18 = plVar25, pBVar23 <= pBVar34)) break;
                  pBVar23 = pBVar23 + -1;
                  plVar37 = plVar25;
                } while (src < plVar25);
              }
            }
            goto LAB_004dc284;
          }
          plVar37 = (long *)((long)plVar26 + ((long)plVar26 - (long)src >> 8) + 1);
        }
        else {
          puVar4 = (ulong *)((long)plVar26 + 5);
          puVar41 = (ulong *)((long)plVar26 + (5 - uVar29));
          puVar27 = puVar4;
          if (puVar4 < puVar1) {
            uVar22 = *puVar4 ^ *puVar41;
            uVar35 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
              }
            }
            uVar35 = uVar35 >> 3 & 0x1fffffff;
            if (*puVar41 == *puVar4) {
              puVar27 = (ulong *)((long)plVar26 + 0xd);
              puVar41 = (ulong *)((long)plVar26 + (0xd - uVar29));
              do {
                if (puVar1 <= puVar27) goto LAB_004dbcdd;
                uVar29 = *puVar41;
                uVar22 = *puVar27;
                uVar36 = uVar22 ^ uVar29;
                uVar35 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar35 = (long)puVar27 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar4);
                puVar27 = puVar27 + 1;
                puVar41 = puVar41 + 1;
              } while (uVar29 == uVar22);
            }
          }
          else {
LAB_004dbcdd:
            if ((puVar27 < puVar2) && ((int)*puVar41 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar41 = (ulong *)((long)puVar41 + 4);
            }
            if ((puVar27 < puVar17) && ((short)*puVar41 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar41 = (ulong *)((long)puVar41 + 2);
            }
            if (puVar27 < puVar5) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar41 == (char)*puVar27));
            }
            uVar35 = (long)puVar27 - (long)puVar4;
          }
          uVar29 = (long)plVar18 - (long)src;
          plVar25 = (long *)seqStore->lit;
          plVar37 = (long *)((long)plVar25 + uVar29);
          do {
            *plVar25 = *src;
            plVar25 = plVar25 + 1;
            src = (void *)((long)src + 8);
          } while (plVar25 < plVar37);
          seqStore->lit = seqStore->lit + uVar29;
          if (0xffff < uVar29) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_R15 = uVar35 + 4;
          uVar35 = uVar35 + 1;
          psVar13 = *ppsVar3;
          psVar13->litLength = (U16)uVar29;
          psVar13->offset = 1;
joined_r0x004dc2f6:
          if (0xffff < uVar35) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar13->matchLength = (U16)uVar35;
          *ppsVar3 = psVar13 + 1;
          plVar37 = (long *)((long)plVar18 + unaff_R15);
          src = plVar37;
          if (plVar37 <= plVar16) {
            lVar12 = *(long *)(pBVar9 + ((long)plVar26 - (long)pBVar9 & 0xffffffffU) + 2);
            pUVar11[(ulong)(lVar12 * -0x30e4432345000000) >> (bVar21 & 0x3f)] = UVar28 + 2;
            pUVar10[(ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = UVar28 + 2;
            lVar12 = *(long *)((long)plVar37 + -2);
            UVar28 = ((int)plVar37 + -2) - iVar40;
            pUVar11[(ulong)(lVar12 * -0x30e4432345000000) >> (bVar21 & 0x3f)] = UVar28;
            pUVar10[(ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = UVar28;
            do {
              uVar39 = uVar38;
              uVar29 = (ulong)local_dc;
              src = plVar37;
              uVar38 = uVar39;
              if ((local_dc == 0) || ((int)*plVar37 != *(int *)((long)plVar37 - uVar29))) break;
              puVar4 = (ulong *)((long)plVar37 + 4);
              puVar41 = (ulong *)((long)plVar37 + (4 - uVar29));
              puVar27 = puVar4;
              if (puVar4 < puVar1) {
                uVar22 = *puVar4 ^ *puVar41;
                uVar35 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar35 = uVar35 >> 3 & 0x1fffffff;
                if (*puVar41 == *puVar4) {
                  puVar27 = (ulong *)((long)plVar37 + 0xc);
                  puVar41 = (ulong *)((long)plVar37 + (0xc - uVar29));
                  do {
                    if (puVar1 <= puVar27) goto LAB_004dbeef;
                    uVar29 = *puVar41;
                    uVar22 = *puVar27;
                    uVar36 = uVar22 ^ uVar29;
                    uVar35 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                      }
                    }
                    uVar35 = (long)puVar27 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar4);
                    puVar27 = puVar27 + 1;
                    puVar41 = puVar41 + 1;
                  } while (uVar29 == uVar22);
                }
              }
              else {
LAB_004dbeef:
                if ((puVar27 < puVar2) && ((int)*puVar41 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar41 = (ulong *)((long)puVar41 + 4);
                }
                if ((puVar27 < puVar17) && ((short)*puVar41 == (short)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar41 = (ulong *)((long)puVar41 + 2);
                }
                if (puVar27 < puVar5) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar41 == (char)*puVar27));
                }
                uVar35 = (long)puVar27 - (long)puVar4;
              }
              lVar12 = *plVar37;
              UVar28 = (int)plVar37 - iVar40;
              pUVar11[(ulong)(lVar12 * -0x30e4432345000000) >> (bVar21 & 0x3f)] = UVar28;
              pUVar10[(ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = UVar28;
              *(long *)seqStore->lit = *plVar37;
              psVar13 = seqStore->sequences;
              psVar13->litLength = 0;
              psVar13->offset = 1;
              if (0xffff < uVar35 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar13->matchLength = (U16)(uVar35 + 1);
              seqStore->sequences = psVar13 + 1;
              plVar37 = (long *)((long)plVar37 + uVar35 + 4);
              src = plVar37;
              uVar38 = local_dc;
              local_dc = uVar39;
            } while (plVar37 <= plVar16);
          }
        }
LAB_004dbfef:
        plVar26 = plVar37;
      } while (plVar37 < plVar16);
    }
  }
  else if (uVar14 == 6) {
    if (plVar26 < plVar16) {
      bVar20 = 0x40 - (char)(ms->cParams).hashLog;
      bVar21 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar17 = (ulong *)((long)puVar5 - 1);
      ppsVar3 = &seqStore->sequences;
      uVar14 = 0xbf9b0000;
      do {
        lVar12 = *plVar26;
        uVar29 = (ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
        uVar35 = (ulong)(lVar12 * -0x30e4432340650000) >> (bVar21 & 0x3f);
        uVar39 = pUVar10[uVar29];
        uVar33 = pUVar11[uVar35];
        UVar28 = (U32)((long)plVar26 - (long)pBVar9);
        pUVar11[uVar35] = UVar28;
        pUVar10[uVar29] = UVar28;
        plVar18 = (long *)((long)plVar26 + 1);
        if ((uVar38 == 0) ||
           (uVar29 = (ulong)uVar38, *(int *)((long)plVar18 - uVar29) != *(int *)((long)plVar26 + 1))
           ) {
          if ((uVar15 < uVar39) && (plVar37 = (long *)(pBVar9 + uVar39), *plVar37 == lVar12)) {
            puVar4 = (ulong *)(plVar26 + 1);
            puVar41 = (ulong *)(plVar37 + 1);
            puVar27 = puVar4;
            if (puVar4 < puVar1) {
              uVar35 = *puVar4 ^ *puVar41;
              uVar29 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar29 = uVar29 >> 3 & 0x1fffffff;
              if (*puVar41 == *puVar4) {
                puVar27 = (ulong *)(plVar26 + 2);
                puVar41 = (ulong *)(plVar37 + 2);
                do {
                  if (puVar1 <= puVar27) goto LAB_004db672;
                  uVar35 = *puVar41;
                  uVar22 = *puVar27;
                  uVar36 = uVar22 ^ uVar35;
                  uVar29 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                    }
                  }
                  uVar29 = (long)puVar27 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar4);
                  puVar27 = puVar27 + 1;
                  puVar41 = puVar41 + 1;
                } while (uVar35 == uVar22);
              }
            }
            else {
LAB_004db672:
              if ((puVar27 < puVar2) && ((int)*puVar41 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                puVar41 = (ulong *)((long)puVar41 + 4);
              }
              if ((puVar27 < puVar17) && ((short)*puVar41 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                puVar41 = (ulong *)((long)puVar41 + 2);
              }
              if (puVar27 < puVar5) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar41 == (char)*puVar27));
              }
              uVar29 = (long)puVar27 - (long)puVar4;
            }
            local_d8 = uVar29 + 8;
            local_b8 = (int)plVar37;
            uVar14 = (int)plVar26 - local_b8;
            plVar18 = plVar26;
            if ((uVar15 < uVar39) && (src < plVar26)) {
              pBVar23 = pBVar9 + ((ulong)uVar39 - 1);
              do {
                plVar37 = (long *)((long)plVar18 - 1);
                if (((BYTE)*plVar37 != *pBVar23) ||
                   (local_d8 = local_d8 + 1, plVar18 = plVar37, pBVar23 <= pBVar34)) break;
                pBVar23 = pBVar23 + -1;
              } while (src < plVar37);
            }
LAB_004db898:
            uVar29 = (long)plVar18 - (long)src;
            plVar25 = (long *)seqStore->lit;
            plVar37 = (long *)((long)plVar25 + uVar29);
            do {
              *plVar25 = *src;
              plVar25 = plVar25 + 1;
              src = (void *)((long)src + 8);
            } while (plVar25 < plVar37);
            seqStore->lit = seqStore->lit + uVar29;
            if (0xffff < uVar29) {
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            uVar35 = local_d8 - 3;
            psVar13 = *ppsVar3;
            psVar13->litLength = (U16)uVar29;
            psVar13->offset = uVar14 + 3;
            local_dc = uVar38;
            uVar38 = uVar14;
            goto joined_r0x004db910;
          }
          if ((uVar15 < uVar33) && (piVar6 = (int *)(pBVar9 + uVar33), *piVar6 == (int)*plVar26)) {
            lVar12 = *plVar18;
            uVar29 = (ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
            uVar39 = pUVar10[uVar29];
            pUVar10[uVar29] = UVar28 + 1;
            plVar37 = plVar26;
            iVar32 = 0;
            if ((uVar15 < uVar39) && (plVar25 = (long *)(pBVar9 + uVar39), *plVar25 == lVar12)) {
              puVar4 = (ulong *)((long)plVar26 + 9);
              puVar27 = (ulong *)(plVar25 + 1);
              puVar41 = puVar4;
              if (puVar4 < puVar1) {
                uVar35 = *puVar4 ^ *puVar27;
                uVar29 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                uVar29 = uVar29 >> 3 & 0x1fffffff;
                if (*puVar27 == *puVar4) {
                  puVar41 = (ulong *)((long)plVar26 + 0x11);
                  puVar27 = (ulong *)(plVar25 + 2);
                  do {
                    if (puVar1 <= puVar41) goto LAB_004db920;
                    uVar35 = *puVar27;
                    uVar22 = *puVar41;
                    uVar36 = uVar22 ^ uVar35;
                    uVar29 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                      }
                    }
                    uVar29 = (long)puVar41 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar4);
                    puVar41 = puVar41 + 1;
                    puVar27 = puVar27 + 1;
                  } while (uVar35 == uVar22);
                }
              }
              else {
LAB_004db920:
                if ((puVar41 < puVar2) && ((int)*puVar27 == (int)*puVar41)) {
                  puVar41 = (ulong *)((long)puVar41 + 4);
                  puVar27 = (ulong *)((long)puVar27 + 4);
                }
                if ((puVar41 < puVar17) && ((short)*puVar27 == (short)*puVar41)) {
                  puVar41 = (ulong *)((long)puVar41 + 2);
                  puVar27 = (ulong *)((long)puVar27 + 2);
                }
                if (puVar41 < puVar5) {
                  puVar41 = (ulong *)((long)puVar41 + (ulong)((char)*puVar27 == (char)*puVar41));
                }
                uVar29 = (long)puVar41 - (long)puVar4;
              }
              local_d8 = uVar29 + 8;
              local_50 = (int)plVar25;
              uVar14 = (int)plVar18 - local_50;
              iVar31 = 7;
              plVar37 = plVar18;
              iVar32 = 7;
              if ((uVar15 < uVar39) && (src < plVar18)) {
                pBVar23 = pBVar9 + ((ulong)uVar39 - 1);
                plVar18 = plVar26;
                while (plVar37 = plVar18, iVar32 = iVar31, (BYTE)*plVar37 == *pBVar23) {
                  local_d8 = local_d8 + 1;
                  if ((pBVar23 <= pBVar34) ||
                     (pBVar23 = pBVar23 + -1, plVar18 = (long *)((long)plVar37 + -1), plVar37 <= src
                     )) goto LAB_004db72f;
                }
                plVar37 = (long *)((long)plVar37 + 1);
              }
            }
LAB_004db72f:
            plVar18 = plVar37;
            if (iVar32 != 7) {
              if (iVar32 != 0) goto LAB_004db65f;
              puVar4 = (ulong *)((long)plVar37 + 4);
              puVar41 = (ulong *)(piVar6 + 1);
              puVar27 = puVar4;
              if (puVar4 < puVar1) {
                uVar35 = *puVar4 ^ *puVar41;
                uVar29 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                uVar29 = uVar29 >> 3 & 0x1fffffff;
                if (*puVar41 == *puVar4) {
                  puVar27 = (ulong *)((long)plVar37 + 0xc);
                  puVar41 = (ulong *)(piVar6 + 3);
                  do {
                    if (puVar1 <= puVar27) goto LAB_004db7dd;
                    uVar35 = *puVar41;
                    uVar22 = *puVar27;
                    uVar36 = uVar22 ^ uVar35;
                    uVar29 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                      }
                    }
                    uVar29 = (long)puVar27 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar4);
                    puVar27 = puVar27 + 1;
                    puVar41 = puVar41 + 1;
                  } while (uVar35 == uVar22);
                }
              }
              else {
LAB_004db7dd:
                if ((puVar27 < puVar2) && ((int)*puVar41 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar41 = (ulong *)((long)puVar41 + 4);
                }
                if ((puVar27 < puVar17) && ((short)*puVar41 == (short)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar41 = (ulong *)((long)puVar41 + 2);
                }
                if (puVar27 < puVar5) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar41 == (char)*puVar27));
                }
                uVar29 = (long)puVar27 - (long)puVar4;
              }
              local_d8 = uVar29 + 4;
              uVar14 = (int)plVar37 - (int)piVar6;
              if ((uVar15 < uVar33) && (src < plVar37)) {
                pBVar23 = pBVar9 + ((ulong)uVar33 - 1);
                do {
                  plVar25 = (long *)((long)plVar37 - 1);
                  plVar18 = plVar37;
                  if (((BYTE)*plVar25 != *pBVar23) ||
                     (local_d8 = local_d8 + 1, plVar18 = plVar25, pBVar23 <= pBVar34)) break;
                  pBVar23 = pBVar23 + -1;
                  plVar37 = plVar25;
                } while (src < plVar25);
              }
            }
            goto LAB_004db898;
          }
          plVar37 = (long *)((long)plVar26 + ((long)plVar26 - (long)src >> 8) + 1);
        }
        else {
          puVar4 = (ulong *)((long)plVar26 + 5);
          puVar41 = (ulong *)((long)plVar26 + (5 - uVar29));
          puVar27 = puVar4;
          if (puVar4 < puVar1) {
            uVar22 = *puVar4 ^ *puVar41;
            uVar35 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
              }
            }
            uVar35 = uVar35 >> 3 & 0x1fffffff;
            if (*puVar41 == *puVar4) {
              puVar27 = (ulong *)((long)plVar26 + 0xd);
              puVar41 = (ulong *)((long)plVar26 + (0xd - uVar29));
              do {
                if (puVar1 <= puVar27) goto LAB_004db34e;
                uVar29 = *puVar41;
                uVar22 = *puVar27;
                uVar36 = uVar22 ^ uVar29;
                uVar35 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar35 = (long)puVar27 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar4);
                puVar27 = puVar27 + 1;
                puVar41 = puVar41 + 1;
              } while (uVar29 == uVar22);
            }
          }
          else {
LAB_004db34e:
            if ((puVar27 < puVar2) && ((int)*puVar41 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar41 = (ulong *)((long)puVar41 + 4);
            }
            if ((puVar27 < puVar17) && ((short)*puVar41 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar41 = (ulong *)((long)puVar41 + 2);
            }
            if (puVar27 < puVar5) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar41 == (char)*puVar27));
            }
            uVar35 = (long)puVar27 - (long)puVar4;
          }
          uVar29 = (long)plVar18 - (long)src;
          plVar25 = (long *)seqStore->lit;
          plVar37 = (long *)((long)plVar25 + uVar29);
          do {
            *plVar25 = *src;
            plVar25 = plVar25 + 1;
            src = (void *)((long)src + 8);
          } while (plVar25 < plVar37);
          seqStore->lit = seqStore->lit + uVar29;
          if (0xffff < uVar29) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          local_d8 = uVar35 + 4;
          uVar35 = uVar35 + 1;
          psVar13 = *ppsVar3;
          psVar13->litLength = (U16)uVar29;
          psVar13->offset = 1;
joined_r0x004db910:
          if (0xffff < uVar35) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar13->matchLength = (U16)uVar35;
          *ppsVar3 = psVar13 + 1;
          plVar37 = (long *)((long)plVar18 + local_d8);
          src = plVar37;
          if (plVar37 <= plVar16) {
            lVar12 = *(long *)(pBVar9 + ((long)plVar26 - (long)pBVar9 & 0xffffffffU) + 2);
            pUVar11[(ulong)(lVar12 * -0x30e4432340650000) >> (bVar21 & 0x3f)] = UVar28 + 2;
            pUVar10[(ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = UVar28 + 2;
            lVar12 = *(long *)((long)plVar37 + -2);
            UVar28 = ((int)plVar37 + -2) - iVar40;
            pUVar11[(ulong)(lVar12 * -0x30e4432340650000) >> (bVar21 & 0x3f)] = UVar28;
            pUVar10[(ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = UVar28;
            do {
              uVar39 = uVar38;
              src = plVar37;
              uVar38 = uVar39;
              if ((local_dc == 0) ||
                 (uVar29 = (ulong)local_dc, (int)*plVar37 != *(int *)((long)plVar37 - uVar29)))
              break;
              puVar4 = (ulong *)((long)plVar37 + 4);
              puVar41 = (ulong *)((long)plVar37 + (4 - uVar29));
              puVar27 = puVar4;
              if (puVar4 < puVar1) {
                uVar22 = *puVar4 ^ *puVar41;
                uVar35 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar35 = uVar35 >> 3 & 0x1fffffff;
                if (*puVar41 == *puVar4) {
                  puVar27 = (ulong *)((long)plVar37 + 0xc);
                  puVar41 = (ulong *)((long)plVar37 + (0xc - uVar29));
                  do {
                    if (puVar1 <= puVar27) goto LAB_004db55e;
                    uVar29 = *puVar41;
                    uVar22 = *puVar27;
                    uVar36 = uVar22 ^ uVar29;
                    uVar35 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                      }
                    }
                    uVar35 = (long)puVar27 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar4);
                    puVar27 = puVar27 + 1;
                    puVar41 = puVar41 + 1;
                  } while (uVar29 == uVar22);
                }
              }
              else {
LAB_004db55e:
                if ((puVar27 < puVar2) && ((int)*puVar41 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar41 = (ulong *)((long)puVar41 + 4);
                }
                if ((puVar27 < puVar17) && ((short)*puVar41 == (short)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar41 = (ulong *)((long)puVar41 + 2);
                }
                if (puVar27 < puVar5) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar41 == (char)*puVar27));
                }
                uVar35 = (long)puVar27 - (long)puVar4;
              }
              lVar12 = *plVar37;
              UVar28 = (int)plVar37 - iVar40;
              pUVar11[(ulong)(lVar12 * -0x30e4432340650000) >> (bVar21 & 0x3f)] = UVar28;
              pUVar10[(ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = UVar28;
              *(long *)seqStore->lit = *plVar37;
              psVar13 = seqStore->sequences;
              psVar13->litLength = 0;
              psVar13->offset = 1;
              if (0xffff < uVar35 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar13->matchLength = (U16)(uVar35 + 1);
              seqStore->sequences = psVar13 + 1;
              plVar37 = (long *)((long)plVar37 + uVar35 + 4);
              src = plVar37;
              uVar38 = local_dc;
              local_dc = uVar39;
            } while (plVar37 <= plVar16);
          }
        }
LAB_004db65f:
        plVar26 = plVar37;
      } while (plVar37 < plVar16);
    }
  }
  else if (uVar14 == 7) {
    if (plVar26 < plVar16) {
      bVar20 = 0x40 - (char)(ms->cParams).hashLog;
      bVar21 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar17 = (ulong *)((long)puVar5 - 1);
      ppsVar3 = &seqStore->sequences;
      uVar14 = 0xbfa56300;
      do {
        lVar12 = *plVar26;
        uVar29 = (ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
        uVar35 = (ulong)(lVar12 * -0x30e44323405a9d00) >> (bVar21 & 0x3f);
        uVar39 = pUVar10[uVar29];
        uVar33 = pUVar11[uVar35];
        UVar28 = (U32)((long)plVar26 - (long)pBVar9);
        pUVar11[uVar35] = UVar28;
        pUVar10[uVar29] = UVar28;
        plVar18 = (long *)((long)plVar26 + 1);
        if ((uVar38 == 0) ||
           (uVar29 = (ulong)uVar38, *(int *)((long)plVar18 - uVar29) != *(int *)((long)plVar26 + 1))
           ) {
          if ((uVar15 < uVar39) && (plVar37 = (long *)(pBVar9 + uVar39), *plVar37 == lVar12)) {
            puVar4 = (ulong *)(plVar26 + 1);
            puVar41 = (ulong *)(plVar37 + 1);
            puVar27 = puVar4;
            if (puVar4 < puVar1) {
              uVar35 = *puVar4 ^ *puVar41;
              uVar29 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar29 = uVar29 >> 3 & 0x1fffffff;
              if (*puVar41 == *puVar4) {
                puVar27 = (ulong *)(plVar26 + 2);
                puVar41 = (ulong *)(plVar37 + 2);
                do {
                  if (puVar1 <= puVar27) goto LAB_004dacd9;
                  uVar35 = *puVar41;
                  uVar22 = *puVar27;
                  uVar36 = uVar22 ^ uVar35;
                  uVar29 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                    }
                  }
                  uVar29 = (long)puVar27 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar4);
                  puVar27 = puVar27 + 1;
                  puVar41 = puVar41 + 1;
                } while (uVar35 == uVar22);
              }
            }
            else {
LAB_004dacd9:
              if ((puVar27 < puVar2) && ((int)*puVar41 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                puVar41 = (ulong *)((long)puVar41 + 4);
              }
              if ((puVar27 < puVar17) && ((short)*puVar41 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                puVar41 = (ulong *)((long)puVar41 + 2);
              }
              if (puVar27 < puVar5) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar41 == (char)*puVar27));
              }
              uVar29 = (long)puVar27 - (long)puVar4;
            }
            local_d8 = uVar29 + 8;
            local_b8 = (int)plVar37;
            uVar14 = (int)plVar26 - local_b8;
            plVar18 = plVar26;
            if ((uVar15 < uVar39) && (src < plVar26)) {
              pBVar23 = pBVar9 + ((ulong)uVar39 - 1);
              do {
                plVar37 = (long *)((long)plVar18 - 1);
                if (((BYTE)*plVar37 != *pBVar23) ||
                   (local_d8 = local_d8 + 1, plVar18 = plVar37, pBVar23 <= pBVar34)) break;
                pBVar23 = pBVar23 + -1;
              } while (src < plVar37);
            }
LAB_004daeff:
            uVar29 = (long)plVar18 - (long)src;
            plVar25 = (long *)seqStore->lit;
            plVar37 = (long *)((long)plVar25 + uVar29);
            do {
              *plVar25 = *src;
              plVar25 = plVar25 + 1;
              src = (void *)((long)src + 8);
            } while (plVar25 < plVar37);
            seqStore->lit = seqStore->lit + uVar29;
            if (0xffff < uVar29) {
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            uVar35 = local_d8 - 3;
            psVar13 = *ppsVar3;
            psVar13->litLength = (U16)uVar29;
            psVar13->offset = uVar14 + 3;
            local_dc = uVar38;
            uVar38 = uVar14;
            goto joined_r0x004daf77;
          }
          if ((uVar15 < uVar33) && (piVar6 = (int *)(pBVar9 + uVar33), *piVar6 == (int)*plVar26)) {
            lVar12 = *plVar18;
            uVar29 = (ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
            uVar39 = pUVar10[uVar29];
            pUVar10[uVar29] = UVar28 + 1;
            plVar37 = plVar26;
            iVar32 = 0;
            if ((uVar15 < uVar39) && (plVar25 = (long *)(pBVar9 + uVar39), *plVar25 == lVar12)) {
              puVar4 = (ulong *)((long)plVar26 + 9);
              puVar27 = (ulong *)(plVar25 + 1);
              puVar41 = puVar4;
              if (puVar4 < puVar1) {
                uVar35 = *puVar4 ^ *puVar27;
                uVar29 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                uVar29 = uVar29 >> 3 & 0x1fffffff;
                if (*puVar27 == *puVar4) {
                  puVar41 = (ulong *)((long)plVar26 + 0x11);
                  puVar27 = (ulong *)(plVar25 + 2);
                  do {
                    if (puVar1 <= puVar41) goto LAB_004daf87;
                    uVar35 = *puVar27;
                    uVar22 = *puVar41;
                    uVar36 = uVar22 ^ uVar35;
                    uVar29 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                      }
                    }
                    uVar29 = (long)puVar41 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar4);
                    puVar41 = puVar41 + 1;
                    puVar27 = puVar27 + 1;
                  } while (uVar35 == uVar22);
                }
              }
              else {
LAB_004daf87:
                if ((puVar41 < puVar2) && ((int)*puVar27 == (int)*puVar41)) {
                  puVar41 = (ulong *)((long)puVar41 + 4);
                  puVar27 = (ulong *)((long)puVar27 + 4);
                }
                if ((puVar41 < puVar17) && ((short)*puVar27 == (short)*puVar41)) {
                  puVar41 = (ulong *)((long)puVar41 + 2);
                  puVar27 = (ulong *)((long)puVar27 + 2);
                }
                if (puVar41 < puVar5) {
                  puVar41 = (ulong *)((long)puVar41 + (ulong)((char)*puVar27 == (char)*puVar41));
                }
                uVar29 = (long)puVar41 - (long)puVar4;
              }
              local_d8 = uVar29 + 8;
              local_50 = (int)plVar25;
              uVar14 = (int)plVar18 - local_50;
              iVar31 = 7;
              plVar37 = plVar18;
              iVar32 = 7;
              if ((uVar15 < uVar39) && (src < plVar18)) {
                pBVar23 = pBVar9 + ((ulong)uVar39 - 1);
                plVar18 = plVar26;
                while (plVar37 = plVar18, iVar32 = iVar31, (BYTE)*plVar37 == *pBVar23) {
                  local_d8 = local_d8 + 1;
                  if ((pBVar23 <= pBVar34) ||
                     (pBVar23 = pBVar23 + -1, plVar18 = (long *)((long)plVar37 + -1), plVar37 <= src
                     )) goto LAB_004dad96;
                }
                plVar37 = (long *)((long)plVar37 + 1);
              }
            }
LAB_004dad96:
            plVar18 = plVar37;
            if (iVar32 != 7) {
              if (iVar32 != 0) goto LAB_004dacc6;
              puVar4 = (ulong *)((long)plVar37 + 4);
              puVar41 = (ulong *)(piVar6 + 1);
              puVar27 = puVar4;
              if (puVar4 < puVar1) {
                uVar35 = *puVar4 ^ *puVar41;
                uVar29 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                uVar29 = uVar29 >> 3 & 0x1fffffff;
                if (*puVar41 == *puVar4) {
                  puVar27 = (ulong *)((long)plVar37 + 0xc);
                  puVar41 = (ulong *)(piVar6 + 3);
                  do {
                    if (puVar1 <= puVar27) goto LAB_004dae44;
                    uVar35 = *puVar41;
                    uVar22 = *puVar27;
                    uVar36 = uVar22 ^ uVar35;
                    uVar29 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                      }
                    }
                    uVar29 = (long)puVar27 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar4);
                    puVar27 = puVar27 + 1;
                    puVar41 = puVar41 + 1;
                  } while (uVar35 == uVar22);
                }
              }
              else {
LAB_004dae44:
                if ((puVar27 < puVar2) && ((int)*puVar41 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar41 = (ulong *)((long)puVar41 + 4);
                }
                if ((puVar27 < puVar17) && ((short)*puVar41 == (short)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar41 = (ulong *)((long)puVar41 + 2);
                }
                if (puVar27 < puVar5) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar41 == (char)*puVar27));
                }
                uVar29 = (long)puVar27 - (long)puVar4;
              }
              local_d8 = uVar29 + 4;
              uVar14 = (int)plVar37 - (int)piVar6;
              if ((uVar15 < uVar33) && (src < plVar37)) {
                pBVar23 = pBVar9 + ((ulong)uVar33 - 1);
                do {
                  plVar25 = (long *)((long)plVar37 - 1);
                  plVar18 = plVar37;
                  if (((BYTE)*plVar25 != *pBVar23) ||
                     (local_d8 = local_d8 + 1, plVar18 = plVar25, pBVar23 <= pBVar34)) break;
                  pBVar23 = pBVar23 + -1;
                  plVar37 = plVar25;
                } while (src < plVar25);
              }
            }
            goto LAB_004daeff;
          }
          plVar37 = (long *)((long)plVar26 + ((long)plVar26 - (long)src >> 8) + 1);
        }
        else {
          puVar4 = (ulong *)((long)plVar26 + 5);
          puVar41 = (ulong *)((long)plVar26 + (5 - uVar29));
          puVar27 = puVar4;
          if (puVar4 < puVar1) {
            uVar22 = *puVar4 ^ *puVar41;
            uVar35 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
              }
            }
            uVar35 = uVar35 >> 3 & 0x1fffffff;
            if (*puVar41 == *puVar4) {
              puVar27 = (ulong *)((long)plVar26 + 0xd);
              puVar41 = (ulong *)((long)plVar26 + (0xd - uVar29));
              do {
                if (puVar1 <= puVar27) goto LAB_004da9b5;
                uVar29 = *puVar41;
                uVar22 = *puVar27;
                uVar36 = uVar22 ^ uVar29;
                uVar35 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar35 = (long)puVar27 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar4);
                puVar27 = puVar27 + 1;
                puVar41 = puVar41 + 1;
              } while (uVar29 == uVar22);
            }
          }
          else {
LAB_004da9b5:
            if ((puVar27 < puVar2) && ((int)*puVar41 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar41 = (ulong *)((long)puVar41 + 4);
            }
            if ((puVar27 < puVar17) && ((short)*puVar41 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar41 = (ulong *)((long)puVar41 + 2);
            }
            if (puVar27 < puVar5) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar41 == (char)*puVar27));
            }
            uVar35 = (long)puVar27 - (long)puVar4;
          }
          uVar29 = (long)plVar18 - (long)src;
          plVar25 = (long *)seqStore->lit;
          plVar37 = (long *)((long)plVar25 + uVar29);
          do {
            *plVar25 = *src;
            plVar25 = plVar25 + 1;
            src = (void *)((long)src + 8);
          } while (plVar25 < plVar37);
          seqStore->lit = seqStore->lit + uVar29;
          if (0xffff < uVar29) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          local_d8 = uVar35 + 4;
          uVar35 = uVar35 + 1;
          psVar13 = *ppsVar3;
          psVar13->litLength = (U16)uVar29;
          psVar13->offset = 1;
joined_r0x004daf77:
          if (0xffff < uVar35) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar13->matchLength = (U16)uVar35;
          *ppsVar3 = psVar13 + 1;
          plVar37 = (long *)((long)plVar18 + local_d8);
          src = plVar37;
          if (plVar37 <= plVar16) {
            lVar12 = *(long *)(pBVar9 + ((long)plVar26 - (long)pBVar9 & 0xffffffffU) + 2);
            pUVar11[(ulong)(lVar12 * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] = UVar28 + 2;
            pUVar10[(ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = UVar28 + 2;
            lVar12 = *(long *)((long)plVar37 + -2);
            UVar28 = ((int)plVar37 + -2) - iVar40;
            pUVar11[(ulong)(lVar12 * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] = UVar28;
            pUVar10[(ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = UVar28;
            do {
              uVar39 = uVar38;
              src = plVar37;
              uVar38 = uVar39;
              if ((local_dc == 0) ||
                 (uVar29 = (ulong)local_dc, (int)*plVar37 != *(int *)((long)plVar37 - uVar29)))
              break;
              puVar4 = (ulong *)((long)plVar37 + 4);
              puVar41 = (ulong *)((long)plVar37 + (4 - uVar29));
              puVar27 = puVar4;
              if (puVar4 < puVar1) {
                uVar22 = *puVar4 ^ *puVar41;
                uVar35 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar35 = uVar35 >> 3 & 0x1fffffff;
                if (*puVar41 == *puVar4) {
                  puVar27 = (ulong *)((long)plVar37 + 0xc);
                  puVar41 = (ulong *)((long)plVar37 + (0xc - uVar29));
                  do {
                    if (puVar1 <= puVar27) goto LAB_004dabc5;
                    uVar29 = *puVar41;
                    uVar22 = *puVar27;
                    uVar36 = uVar22 ^ uVar29;
                    uVar35 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                      }
                    }
                    uVar35 = (long)puVar27 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar4);
                    puVar27 = puVar27 + 1;
                    puVar41 = puVar41 + 1;
                  } while (uVar29 == uVar22);
                }
              }
              else {
LAB_004dabc5:
                if ((puVar27 < puVar2) && ((int)*puVar41 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar41 = (ulong *)((long)puVar41 + 4);
                }
                if ((puVar27 < puVar17) && ((short)*puVar41 == (short)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar41 = (ulong *)((long)puVar41 + 2);
                }
                if (puVar27 < puVar5) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar41 == (char)*puVar27));
                }
                uVar35 = (long)puVar27 - (long)puVar4;
              }
              lVar12 = *plVar37;
              UVar28 = (int)plVar37 - iVar40;
              pUVar11[(ulong)(lVar12 * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] = UVar28;
              pUVar10[(ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = UVar28;
              *(long *)seqStore->lit = *plVar37;
              psVar13 = seqStore->sequences;
              psVar13->litLength = 0;
              psVar13->offset = 1;
              if (0xffff < uVar35 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar13->matchLength = (U16)(uVar35 + 1);
              seqStore->sequences = psVar13 + 1;
              plVar37 = (long *)((long)plVar37 + uVar35 + 4);
              src = plVar37;
              uVar38 = local_dc;
              local_dc = uVar39;
            } while (plVar37 <= plVar16);
          }
        }
LAB_004dacc6:
        plVar26 = plVar37;
      } while (plVar37 < plVar16);
    }
  }
  else if (plVar26 < plVar16) {
    bVar20 = 0x40 - (char)(ms->cParams).hashLog;
    bVar21 = 0x20 - (char)(ms->cParams).chainLog;
    puVar1 = (ulong *)((long)puVar5 - 7);
    puVar2 = (ulong *)((long)puVar5 - 3);
    puVar17 = (ulong *)((long)puVar5 - 1);
    ppsVar3 = &seqStore->sequences;
    pBVar23 = pBVar9 + -1;
    pBVar19 = pBVar23;
    local_d0 = puVar2;
    do {
      uVar29 = (ulong)(*plVar26 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
      uVar33 = (uint)((int)*plVar26 * -0x61c8864f) >> (bVar21 & 0x1f);
      uVar14 = pUVar10[uVar29];
      uVar39 = pUVar11[uVar33];
      UVar28 = (U32)((long)plVar26 - (long)pBVar9);
      pUVar11[uVar33] = UVar28;
      pUVar10[uVar29] = UVar28;
      plVar18 = (long *)((long)plVar26 + 1);
      if ((uVar38 == 0) ||
         (uVar29 = (ulong)uVar38, *(int *)((long)plVar18 - uVar29) != *(int *)((long)plVar26 + 1)))
      {
        if ((uVar15 < uVar14) && (plVar37 = (long *)(pBVar9 + uVar14), *plVar37 == *plVar26)) {
          puVar4 = (ulong *)(plVar26 + 1);
          puVar41 = (ulong *)(plVar37 + 1);
          puVar27 = puVar4;
          if (puVar4 < puVar1) {
            uVar35 = *puVar4 ^ *puVar41;
            uVar29 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
              }
            }
            uVar29 = uVar29 >> 3 & 0x1fffffff;
            if (*puVar41 == *puVar4) {
              puVar27 = (ulong *)(plVar26 + 2);
              puVar41 = (ulong *)(plVar37 + 2);
              do {
                if (puVar1 <= puVar27) goto LAB_004dc92f;
                uVar35 = *puVar41;
                uVar22 = *puVar27;
                uVar36 = uVar22 ^ uVar35;
                uVar29 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                uVar29 = (long)puVar27 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar4);
                puVar27 = puVar27 + 1;
                puVar41 = puVar41 + 1;
              } while (uVar35 == uVar22);
            }
          }
          else {
LAB_004dc92f:
            if ((puVar27 < puVar2) && ((int)*puVar41 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar41 = (ulong *)((long)puVar41 + 4);
            }
            if ((puVar27 < puVar17) && ((short)*puVar41 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar41 = (ulong *)((long)puVar41 + 2);
            }
            if (puVar27 < puVar5) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar41 == (char)*puVar27));
            }
            uVar29 = (long)puVar27 - (long)puVar4;
          }
          pBVar19 = (BYTE *)(uVar29 + 8);
          local_d0 = (ulong *)(ulong)(uint)((int)plVar26 - (int)plVar37);
          plVar18 = plVar26;
          if ((uVar15 < uVar14) && (src < plVar26)) {
            pBVar24 = pBVar23 + uVar14;
            do {
              plVar37 = (long *)((long)plVar18 - 1);
              if (((BYTE)*plVar37 != *pBVar24) ||
                 (pBVar19 = pBVar19 + 1, plVar18 = plVar37, pBVar24 <= pBVar34)) break;
              pBVar24 = pBVar24 + -1;
            } while (src < plVar37);
          }
LAB_004dcbd1:
          uVar29 = (long)plVar18 - (long)src;
          plVar25 = (long *)seqStore->lit;
          plVar37 = (long *)((long)plVar25 + uVar29);
          do {
            *plVar25 = *src;
            plVar25 = plVar25 + 1;
            src = (void *)((long)src + 8);
          } while (plVar25 < plVar37);
          seqStore->lit = seqStore->lit + uVar29;
          if (0xffff < uVar29) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          pBVar24 = pBVar19 + -3;
          psVar13 = *ppsVar3;
          psVar13->litLength = (U16)uVar29;
          psVar13->offset = (uint)local_d0 + 3;
          local_dc = uVar38;
          uVar38 = (uint)local_d0;
          goto joined_r0x004dcc48;
        }
        if ((uVar15 < uVar39) && (piVar6 = (int *)(pBVar9 + uVar39), *piVar6 == (int)*plVar26)) {
          lVar12 = *plVar18;
          uVar29 = (ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
          uVar14 = pUVar10[uVar29];
          pUVar10[uVar29] = UVar28 + 1;
          iVar32 = 0;
          plVar37 = plVar26;
          if ((uVar15 < uVar14) && (plVar25 = (long *)(pBVar9 + uVar14), *plVar25 == lVar12)) {
            puVar4 = (ulong *)((long)plVar26 + 9);
            local_d0 = (ulong *)(plVar25 + 1);
            puVar27 = puVar4;
            if (puVar4 < puVar1) {
              uVar35 = *puVar4 ^ *local_d0;
              uVar29 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar29 = uVar29 >> 3 & 0x1fffffff;
              if (*local_d0 == *puVar4) {
                puVar27 = (ulong *)((long)plVar26 + 0x11);
                local_d0 = (ulong *)(plVar25 + 2);
                do {
                  if (puVar1 <= puVar27) goto LAB_004dc9e6;
                  uVar35 = *local_d0;
                  uVar22 = *puVar27;
                  uVar36 = uVar22 ^ uVar35;
                  uVar29 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                    }
                  }
                  uVar29 = (long)puVar27 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar4);
                  puVar27 = puVar27 + 1;
                  local_d0 = local_d0 + 1;
                } while (uVar35 == uVar22);
              }
            }
            else {
LAB_004dc9e6:
              if ((puVar27 < puVar2) && ((int)*local_d0 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                local_d0 = (ulong *)((long)local_d0 + 4);
              }
              if ((puVar27 < puVar17) && ((short)*local_d0 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                local_d0 = (ulong *)((long)local_d0 + 2);
              }
              if (puVar27 < puVar5) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*local_d0 == (char)*puVar27));
              }
              uVar29 = (long)puVar27 - (long)puVar4;
            }
            pBVar19 = (BYTE *)(uVar29 + 8);
            iend._0_4_ = (int)plVar25;
            local_d0 = (ulong *)(ulong)(uint)((int)plVar18 - (int)iend);
            iVar32 = 7;
            plVar37 = plVar18;
            if ((uVar15 < uVar14) && (src < plVar18)) {
              pBVar24 = pBVar23 + uVar14;
              plVar18 = plVar26;
              while (plVar37 = plVar18, (BYTE)*plVar37 == *pBVar24) {
                pBVar19 = pBVar19 + 1;
                if ((pBVar24 <= pBVar34) ||
                   (pBVar24 = pBVar24 + -1, plVar18 = (long *)((long)plVar37 + -1), plVar37 <= src))
                goto LAB_004dcaa5;
              }
              plVar37 = (long *)((long)plVar37 + 1);
            }
          }
LAB_004dcaa5:
          plVar18 = plVar37;
          if (iVar32 != 7) {
            if (iVar32 != 0) goto LAB_004dc91c;
            puVar4 = (ulong *)((long)plVar37 + 4);
            puVar41 = (ulong *)(piVar6 + 1);
            puVar27 = puVar4;
            if (puVar4 < puVar1) {
              uVar35 = *puVar4 ^ *puVar41;
              uVar29 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar29 = uVar29 >> 3 & 0x1fffffff;
              if (*puVar41 == *puVar4) {
                puVar27 = (ulong *)((long)plVar37 + 0xc);
                puVar41 = (ulong *)(piVar6 + 3);
                do {
                  if (puVar1 <= puVar27) goto LAB_004dcb2f;
                  uVar35 = *puVar41;
                  uVar22 = *puVar27;
                  uVar36 = uVar22 ^ uVar35;
                  uVar29 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                    }
                  }
                  uVar29 = (long)puVar27 + ((uVar29 >> 3 & 0x1fffffff) - (long)puVar4);
                  puVar27 = puVar27 + 1;
                  puVar41 = puVar41 + 1;
                } while (uVar35 == uVar22);
              }
            }
            else {
LAB_004dcb2f:
              if ((puVar27 < puVar2) && ((int)*puVar41 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                puVar41 = (ulong *)((long)puVar41 + 4);
              }
              if ((puVar27 < puVar17) && ((short)*puVar41 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                puVar41 = (ulong *)((long)puVar41 + 2);
              }
              if (puVar27 < puVar5) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar41 == (char)*puVar27));
              }
              uVar29 = (long)puVar27 - (long)puVar4;
            }
            pBVar19 = (BYTE *)(uVar29 + 4);
            local_d8._0_4_ = (int)piVar6;
            local_d0 = (ulong *)(ulong)(uint)((int)plVar37 - (int)local_d8);
            if ((uVar15 < uVar39) && (src < plVar37)) {
              pBVar24 = pBVar23 + uVar39;
              do {
                plVar25 = (long *)((long)plVar37 - 1);
                plVar18 = plVar37;
                if (((BYTE)*plVar25 != *pBVar24) ||
                   (pBVar19 = pBVar19 + 1, plVar18 = plVar25, pBVar24 <= pBVar34)) break;
                pBVar24 = pBVar24 + -1;
                plVar37 = plVar25;
              } while (src < plVar25);
            }
          }
          goto LAB_004dcbd1;
        }
        plVar37 = (long *)((long)plVar26 + ((long)plVar26 - (long)src >> 8) + 1);
      }
      else {
        puVar4 = (ulong *)((long)plVar26 + 5);
        puVar41 = (ulong *)((long)plVar26 + (5 - uVar29));
        puVar27 = puVar4;
        if (puVar4 < puVar1) {
          uVar22 = *puVar4 ^ *puVar41;
          uVar35 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
            }
          }
          uVar35 = uVar35 >> 3 & 0x1fffffff;
          if (*puVar41 == *puVar4) {
            puVar27 = (ulong *)((long)plVar26 + 0xd);
            puVar41 = (ulong *)((long)plVar26 + (0xd - uVar29));
            do {
              if (puVar1 <= puVar27) goto LAB_004dc5ff;
              uVar29 = *puVar41;
              uVar22 = *puVar27;
              uVar36 = uVar22 ^ uVar29;
              uVar35 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar35 = (long)puVar27 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar4);
              puVar27 = puVar27 + 1;
              puVar41 = puVar41 + 1;
            } while (uVar29 == uVar22);
          }
        }
        else {
LAB_004dc5ff:
          if ((puVar27 < puVar2) && ((int)*puVar41 == (int)*puVar27)) {
            puVar27 = (ulong *)((long)puVar27 + 4);
            puVar41 = (ulong *)((long)puVar41 + 4);
          }
          if ((puVar27 < puVar17) && ((short)*puVar41 == (short)*puVar27)) {
            puVar27 = (ulong *)((long)puVar27 + 2);
            puVar41 = (ulong *)((long)puVar41 + 2);
          }
          if (puVar27 < puVar5) {
            puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar41 == (char)*puVar27));
          }
          uVar35 = (long)puVar27 - (long)puVar4;
        }
        uVar29 = (long)plVar18 - (long)src;
        plVar25 = (long *)seqStore->lit;
        plVar37 = (long *)((long)plVar25 + uVar29);
        do {
          *plVar25 = *src;
          plVar25 = plVar25 + 1;
          src = (void *)((long)src + 8);
        } while (plVar25 < plVar37);
        seqStore->lit = seqStore->lit + uVar29;
        if (0xffff < uVar29) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        pBVar19 = (BYTE *)(uVar35 + 4);
        pBVar24 = (BYTE *)(uVar35 + 1);
        psVar13 = *ppsVar3;
        psVar13->litLength = (U16)uVar29;
        psVar13->offset = 1;
joined_r0x004dcc48:
        if ((BYTE *)0xffff < pBVar24) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar13->matchLength = (U16)pBVar24;
        *ppsVar3 = psVar13 + 1;
        plVar37 = (long *)((long)plVar18 + (long)pBVar19);
        src = plVar37;
        if (plVar37 <= plVar16) {
          uVar29 = (long)plVar26 - (long)pBVar9 & 0xffffffff;
          pUVar11[(uint)(*(int *)(pBVar9 + uVar29 + 2) * -0x61c8864f) >> (bVar21 & 0x1f)] =
               UVar28 + 2;
          pUVar10[(ulong)(*(long *)(pBVar9 + uVar29 + 2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)]
               = UVar28 + 2;
          UVar28 = ((int)plVar37 + -2) - iVar40;
          pUVar11[(uint)(*(int *)((long)plVar37 + -2) * -0x61c8864f) >> (bVar21 & 0x1f)] = UVar28;
          pUVar10[(ulong)(*(long *)((long)plVar37 + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
               UVar28;
          do {
            uVar14 = uVar38;
            src = plVar37;
            uVar38 = uVar14;
            if (local_dc == 0) break;
            uVar29 = (ulong)local_dc;
            if ((int)*plVar37 != *(int *)((long)plVar37 - uVar29)) break;
            puVar4 = (ulong *)((long)plVar37 + 4);
            puVar41 = (ulong *)((long)plVar37 + (4 - uVar29));
            puVar27 = puVar4;
            if (puVar4 < puVar1) {
              uVar22 = *puVar4 ^ *puVar41;
              uVar35 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar35 = uVar35 >> 3 & 0x1fffffff;
              if (*puVar41 == *puVar4) {
                puVar27 = (ulong *)((long)plVar37 + 0xc);
                puVar41 = (ulong *)((long)plVar37 + (0xc - uVar29));
                do {
                  if (puVar1 <= puVar27) goto LAB_004dc815;
                  uVar29 = *puVar41;
                  uVar22 = *puVar27;
                  uVar36 = uVar22 ^ uVar29;
                  uVar35 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                    }
                  }
                  uVar35 = (long)puVar27 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar4);
                  puVar27 = puVar27 + 1;
                  puVar41 = puVar41 + 1;
                } while (uVar29 == uVar22);
              }
            }
            else {
LAB_004dc815:
              if ((puVar27 < puVar2) && ((int)*puVar41 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                puVar41 = (ulong *)((long)puVar41 + 4);
              }
              if ((puVar27 < puVar17) && ((short)*puVar41 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                puVar41 = (ulong *)((long)puVar41 + 2);
              }
              if (puVar27 < puVar5) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar41 == (char)*puVar27));
              }
              uVar35 = (long)puVar27 - (long)puVar4;
            }
            UVar28 = (int)plVar37 - iVar40;
            pUVar11[(uint)((int)*plVar37 * -0x61c8864f) >> (bVar21 & 0x1f)] = UVar28;
            pUVar10[(ulong)(*plVar37 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = UVar28;
            *(long *)seqStore->lit = *plVar37;
            psVar13 = seqStore->sequences;
            psVar13->litLength = 0;
            psVar13->offset = 1;
            if (0xffff < uVar35 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar13->matchLength = (U16)(uVar35 + 1);
            seqStore->sequences = psVar13 + 1;
            plVar37 = (long *)((long)plVar37 + uVar35 + 4);
            src = plVar37;
            uVar38 = local_dc;
            local_dc = uVar14;
          } while (plVar37 <= plVar16);
        }
      }
LAB_004dc91c:
      plVar26 = plVar37;
    } while (plVar37 < plVar16);
  }
  uVar15 = 0;
  if (uVar30 < uVar8) {
    uVar15 = uVar8;
  }
  if (uVar30 < uVar7) {
    uVar15 = uVar7;
  }
  if (uVar38 == 0) {
    uVar38 = uVar15;
  }
  if (local_dc != 0) {
    uVar15 = local_dc;
  }
  *rep = uVar38;
  rep[1] = uVar15;
  return (long)puVar5 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_noDict);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_noDict);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_noDict);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_noDict);
    }
}